

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_cm.c
# Opt level: O1

jas_cmprof_t * jas_cmprof_createfromclrspc(int clrspc)

{
  int iVar1;
  jas_cmprof_t *pjVar2;
  jas_cmpxform_t *pxform;
  jas_cmpxform_s *pxform_00;
  jas_iccprof_t *iccprof;
  long lVar3;
  
  if (clrspc == 0x501) {
    pjVar2 = jas_cmprof_createfromclrspc(0x401);
    if (pjVar2 == (jas_cmprof_t *)0x0) {
LAB_0010a759:
      pxform_00 = (jas_cmpxform_s *)0x0;
      pxform = (jas_cmpxform_s *)0x0;
LAB_0010a75f:
      if ((pxform != (jas_cmpxform_s *)0x0) &&
         (iVar1 = pxform->refcnt, pxform->refcnt = iVar1 + -1, iVar1 < 2)) {
        (*pxform->ops->destroy)(pxform);
        jas_free(pxform);
      }
      if (pxform_00 != (jas_cmpxform_s *)0x0) {
        iVar1 = pxform_00->refcnt;
        pxform_00->refcnt = iVar1 + -1;
        pjVar2 = (jas_cmprof_t *)0x0;
        goto joined_r0x0010a796;
      }
      pjVar2 = (jas_cmprof_t *)0x0;
    }
    else {
      pjVar2->clrspc = 0x501;
      if ((pjVar2->numchans != 3) || (pjVar2->numrefchans != 3)) {
        __assert_fail("prof->numchans == 3 && prof->numrefchans == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_cm.c"
                      ,0xba,"jas_cmprof_t *jas_cmprof_createsycc()");
      }
      if (pjVar2->refclrspc != 0x101) {
        __assert_fail("prof->refclrspc == JAS_CLRSPC_CIEXYZ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_cm.c"
                      ,0xbb,"jas_cmprof_t *jas_cmprof_createsycc()");
      }
      pxform = jas_cmpxform_createshapmat();
      if (pxform == (jas_cmpxform_t *)0x0) goto LAB_0010a759;
      pxform->numinchans = 3;
      pxform->numoutchans = 3;
      (pxform->data).dummy = 0.0;
      *(undefined8 *)((long)&pxform->data + 8) = 0x100000000;
      (pxform->data).shapmat.mat[0][0] = 1.0;
      (pxform->data).shapmat.mat[0][1] = 0.0;
      (pxform->data).shapmat.mat[0][2] = 1.402;
      (pxform->data).shapmat.mat[1][0] = 1.0;
      (pxform->data).shapmat.mat[1][1] = -0.34413;
      (pxform->data).shapmat.mat[1][2] = -0.71414;
      (pxform->data).shapmat.mat[2][0] = 1.0;
      (pxform->data).shapmat.mat[2][1] = 1.772;
      (pxform->data).shapmat.mat[2][2] = 0.0;
      (pxform->data).shapmat.mat[0][3] = -0.701;
      (pxform->data).shapmat.mat[1][3] = 0.529135;
      (pxform->data).shapmat.mat[2][3] = -0.886;
      pxform_00 = jas_cmpxform_createshapmat();
      if (pxform_00 == (jas_cmpxform_t *)0x0) {
        pxform_00 = (jas_cmpxform_s *)0x0;
        goto LAB_0010a75f;
      }
      pxform_00->numinchans = 3;
      pxform_00->numoutchans = 3;
      (pxform_00->data).dummy = 2.12199579096527e-314;
      *(undefined8 *)((long)&pxform_00->data + 8) = 0x100000000;
      jas_cmshapmat_invmat((pxform_00->data).shapmat.mat,(pxform->data).shapmat.mat);
      lVar3 = 3;
      do {
        if (((pjVar2->pxformseqs[lVar3 + -3] != (jas_cmpxformseq_t *)0x0) &&
            (iVar1 = jas_cmpxformseq_insertpxform(pjVar2->pxformseqs[lVar3 + -3],0,pxform),
            iVar1 != 0)) ||
           ((pjVar2->pxformseqs[lVar3 + 1] != (jas_cmpxformseq_t *)0x0 &&
            (iVar1 = jas_cmpxformseq_insertpxform(pjVar2->pxformseqs[lVar3 + 1],-1,pxform_00),
            iVar1 != 0)))) goto LAB_0010a75f;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 7);
      iVar1 = pxform->refcnt;
      pxform->refcnt = iVar1 + -1;
      if (iVar1 < 2) {
        (*pxform->ops->destroy)(pxform);
        jas_free(pxform);
      }
      iVar1 = pxform_00->refcnt;
      pxform_00->refcnt = iVar1 + -1;
joined_r0x0010a796:
      if (iVar1 < 2) {
        (*pxform_00->ops->destroy)(pxform_00);
        jas_free(pxform_00);
      }
    }
    if (pjVar2 != (jas_cmprof_t *)0x0) {
      return pjVar2;
    }
  }
  else {
    iccprof = jas_iccprof_createfromclrspc(clrspc);
    if (iccprof != (jas_iccprof_t *)0x0) {
      pjVar2 = jas_cmprof_createfromiccprof(iccprof);
      if (pjVar2 != (jas_cmprof_t *)0x0) {
        jas_iccprof_destroy(iccprof);
        if ((char)clrspc == '\0') {
          return pjVar2;
        }
        pjVar2->clrspc = clrspc;
        return pjVar2;
      }
      goto LAB_0010a7b5;
    }
  }
  iccprof = (jas_iccprof_t *)0x0;
LAB_0010a7b5:
  if (iccprof != (jas_iccprof_t *)0x0) {
    jas_iccprof_destroy(iccprof);
  }
  return (jas_cmprof_t *)0x0;
}

Assistant:

jas_cmprof_t *jas_cmprof_createfromclrspc(int clrspc)
{
	jas_iccprof_t *iccprof;
	jas_cmprof_t *prof;

	iccprof = 0;
	prof = 0;
	switch (clrspc) {
	case JAS_CLRSPC_SYCBCR:
		if (!(prof = jas_cmprof_createsycc()))
			goto error;
		break;
	default:
		if (!(iccprof = jas_iccprof_createfromclrspc(clrspc)))
			goto error;
		if (!(prof = jas_cmprof_createfromiccprof(iccprof)))
			goto error;
		jas_iccprof_destroy(iccprof);
		iccprof = 0;
		if (!jas_clrspc_isgeneric(clrspc))
			prof->clrspc = clrspc;
		break;
	}
	return prof;
error:
	if (iccprof)
		jas_iccprof_destroy(iccprof);
	return 0;
}